

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O2

int run_test_connection_fail(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  connection_fail(on_connect_with_close);
  eval_a = (int64_t)timer_close_cb_calls;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = (int64_t)timer_cb_calls;
    eval_b = 0;
    if (eval_a == 0) {
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      eval_a = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar2 = 0x85;
    }
    else {
      pcVar4 = "0";
      pcVar3 = "timer_cb_calls";
      uVar2 = 0x83;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "timer_close_cb_calls";
    uVar2 = 0x82;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-connection-fail.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(connection_fail) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  connection_fail(on_connect_with_close);

  ASSERT_OK(timer_close_cb_calls);
  ASSERT_OK(timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}